

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

parse_error *
nlohmann::detail::parse_error::create
          (parse_error *__return_storage_ptr__,int id_,position_t *pos,string *what_arg)

{
  ulong uVar1;
  size_t sVar2;
  parse_error *ppVar3;
  long *plVar4;
  undefined8 *puVar5;
  ulong *puVar6;
  long *plVar7;
  size_type *psVar8;
  ulong uVar9;
  undefined8 uVar10;
  string local_118;
  long *local_f8;
  long local_f0;
  long local_e8;
  long lStack_e0;
  parse_error *local_d8;
  size_type *local_d0;
  string w;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  string local_90;
  long *local_70;
  undefined8 local_68;
  long local_60;
  undefined8 uStack_58;
  ulong *local_50;
  position_t *local_48;
  ulong local_40;
  long lStack_38;
  
  w.field_2._8_8_ = &local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)((long)&w.field_2 + 8),"parse_error","")
  ;
  exception::name(&local_118,(string *)((long)&w.field_2 + 8),id_);
  local_d8 = __return_storage_ptr__;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_118);
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_40 = *puVar6;
    lStack_38 = plVar4[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *puVar6;
    local_50 = (ulong *)*plVar4;
  }
  local_48 = (position_t *)plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  position_string_abi_cxx11_(&local_90,(parse_error *)pos,local_48);
  uVar1 = (long)&local_48->chars_read_total + local_90._M_string_length;
  uVar9 = 0xf;
  if (local_50 != &local_40) {
    uVar9 = local_40;
  }
  if (uVar9 < uVar1) {
    uVar10 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      uVar10 = local_90.field_2._M_allocated_capacity;
    }
    if (uVar1 <= (ulong)uVar10) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_50);
      goto LAB_00124eef;
    }
  }
  puVar5 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_90._M_dataplus._M_p);
LAB_00124eef:
  local_70 = &local_60;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_60 = *plVar4;
    uStack_58 = puVar5[3];
  }
  else {
    local_60 = *plVar4;
    local_70 = (long *)*puVar5;
  }
  local_68 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_70);
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_e8 = *plVar7;
    lStack_e0 = plVar4[3];
    local_f8 = &local_e8;
  }
  else {
    local_e8 = *plVar7;
    local_f8 = (long *)*plVar4;
  }
  local_f0 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_f8,(ulong)(what_arg->_M_dataplus)._M_p);
  psVar8 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar8) {
    w._M_string_length = *psVar8;
    w.field_2._M_allocated_capacity = plVar4[3];
    local_d0 = &w._M_string_length;
  }
  else {
    w._M_string_length = *psVar8;
    local_d0 = (size_type *)*plVar4;
  }
  w._M_dataplus._M_p = (pointer)plVar4[1];
  *plVar4 = (long)psVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_f8 != &local_e8) {
    operator_delete(local_f8,local_e8 + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)w.field_2._8_8_ != &local_a0) {
    operator_delete((void *)w.field_2._8_8_,local_a0._M_allocated_capacity + 1);
  }
  ppVar3 = local_d8;
  sVar2 = pos->chars_read_total;
  exception::exception(&local_d8->super_exception,id_,(char *)local_d0);
  *(undefined ***)&ppVar3->super_exception = &PTR__exception_00168d10;
  ppVar3->byte = sVar2;
  if (local_d0 != &w._M_string_length) {
    operator_delete(local_d0,w._M_string_length + 1);
  }
  return ppVar3;
}

Assistant:

static parse_error create(int id_, const position_t& pos, const std::string& what_arg)
    {
        std::string w = exception::name("parse_error", id_) + "parse error" +
                        position_string(pos) + ": " + what_arg;
        return parse_error(id_, pos.chars_read_total, w.c_str());
    }